

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O1

void __thiscall gvr::PointCloud::loadPLY(PointCloud *this,PLYReader *ply)

{
  size_t *psVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  bool bVar6;
  PLYReader *this_00;
  ply_type pVar7;
  ply_type pVar8;
  ply_type pVar9;
  long lVar10;
  ulong uVar11;
  FloatArrayReceiver ss;
  FloatArrayReceiver sy;
  FloatArrayReceiver sx;
  FloatArrayReceiver se;
  FloatArrayReceiver vx;
  FloatArrayReceiver vz;
  FloatArrayReceiver vy;
  FloatArrayReceiver sz;
  FloatArrayReceiver sc;
  FloatArrayReceiver local_2a0;
  PLYReader *local_280;
  FloatArrayReceiver local_278;
  FloatArrayReceiver local_258;
  FloatArrayReceiver local_238;
  string local_218;
  string local_1f8;
  FloatArrayReceiver local_1d8;
  FloatArrayReceiver local_1b8;
  FloatArrayReceiver local_198;
  long local_178;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  FloatArrayReceiver local_70;
  FloatArrayReceiver local_50;
  
  psVar1 = &local_1d8.size;
  local_1d8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"vertex","");
  lVar10 = PLYReader::instancesOfElement(ply,(string *)&local_1d8);
  if (local_1d8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_1d8.super_PLYReceiver._vptr_PLYReceiver);
  }
  Model::setOriginFromPLY(&this->super_Model,ply);
  local_1d8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"vertex","");
  local_198.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_198.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"scan_size","");
  pVar7 = PLYReader::getTypeOfProperty(ply,(string *)&local_1d8,(string *)&local_198);
  uVar11 = 1;
  if (pVar7 == ply_none) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"vertex","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"scan_error","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_90,&local_b0);
    if (pVar8 != ply_none) goto LAB_00125ee7;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"vertex","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"scan_conf","");
    pVar8 = PLYReader::getTypeOfProperty(ply,&local_d0,&local_f0);
    uVar11 = (ulong)(pVar8 != ply_none);
    bVar6 = true;
  }
  else {
LAB_00125ee7:
    bVar6 = false;
  }
  local_1b8.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_1b8.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"vertex","");
  local_2a0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)&local_2a0.size;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"sx","");
  local_280 = ply;
  local_178 = lVar10;
  pVar8 = PLYReader::getTypeOfProperty(ply,(string *)&local_1b8,(string *)&local_2a0);
  if (pVar8 != ply_none) {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"vertex","");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"sy","");
    pVar9 = PLYReader::getTypeOfProperty(local_280,&local_110,&local_130);
    if (pVar9 != ply_none) {
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"vertex","");
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"sz","");
      PLYReader::getTypeOfProperty(local_280,&local_150,&local_170);
      bVar5 = true;
      goto LAB_0012605c;
    }
  }
  bVar5 = false;
LAB_0012605c:
  (*(this->super_Model)._vptr_Model[9])(this,local_178,uVar11);
  if (bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
  }
  if (pVar8 != ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  if (local_2a0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_2a0.size) {
    operator_delete(local_2a0.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_1b8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_1b8.size) {
    operator_delete(local_1b8.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (bVar6) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (pVar7 == ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if (local_198.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_198.size) {
    operator_delete(local_198.super_PLYReceiver._vptr_PLYReceiver);
  }
  this_00 = local_280;
  psVar1 = &local_2a0.size;
  if (local_1d8.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)&local_1d8.size) {
    operator_delete(local_1d8.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_1d8,this->vertex,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_198,this->vertex,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_1b8,this->vertex,3,2);
  local_2a0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"vertex","");
  psVar2 = &local_238.size;
  local_238.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"x","");
  PLYReader::setReceiver
            (this_00,(string *)&local_2a0,(string *)&local_238,&local_1d8.super_PLYReceiver);
  if (local_238.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar2) {
    operator_delete(local_238.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_2a0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_2a0.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_2a0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"vertex","");
  local_238.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"y","");
  PLYReader::setReceiver
            (this_00,(string *)&local_2a0,(string *)&local_238,&local_198.super_PLYReceiver);
  if (local_238.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar2) {
    operator_delete(local_238.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_2a0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_2a0.super_PLYReceiver._vptr_PLYReceiver);
  }
  local_2a0.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"vertex","");
  local_238.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"z","");
  PLYReader::setReceiver
            (this_00,(string *)&local_2a0,(string *)&local_238,&local_1b8.super_PLYReceiver);
  if (local_238.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar2) {
    operator_delete(local_238.super_PLYReceiver._vptr_PLYReceiver);
  }
  if (local_2a0.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
    operator_delete(local_2a0.super_PLYReceiver._vptr_PLYReceiver);
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_2a0,this->scanprop,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_238,this->scanprop,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_50,this->scanprop,3,2);
  if (this->scanprop != (float *)0x0) {
    psVar1 = &local_258.size;
    local_258.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"vertex","");
    psVar2 = &local_278.size;
    local_278.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"scan_size","");
    PLYReader::setReceiver
              (this_00,(string *)&local_258,(string *)&local_278,&local_2a0.super_PLYReceiver);
    if (local_278.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar2) {
      operator_delete(local_278.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_258.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_258.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_258.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"vertex","");
    local_278.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"scan_error","");
    PLYReader::setReceiver
              (this_00,(string *)&local_258,(string *)&local_278,&local_238.super_PLYReceiver);
    if (local_278.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar2) {
      operator_delete(local_278.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_258.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_258.super_PLYReceiver._vptr_PLYReceiver);
    }
    local_258.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"vertex","");
    local_278.super_PLYReceiver._vptr_PLYReceiver = (_func_int **)psVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"scan_conf","");
    PLYReader::setReceiver
              (this_00,(string *)&local_258,(string *)&local_278,&local_50.super_PLYReceiver);
    if (local_278.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar2) {
      operator_delete(local_278.super_PLYReceiver._vptr_PLYReceiver);
    }
    if (local_258.super_PLYReceiver._vptr_PLYReceiver != (_func_int **)psVar1) {
      operator_delete(local_258.super_PLYReceiver._vptr_PLYReceiver);
    }
  }
  FloatArrayReceiver::FloatArrayReceiver(&local_258,this->scanpos,3,0);
  FloatArrayReceiver::FloatArrayReceiver(&local_278,this->scanpos,3,1);
  FloatArrayReceiver::FloatArrayReceiver(&local_70,this->scanpos,3,2);
  if (this->scanpos != (float *)0x0) {
    paVar3 = &local_1f8.field_2;
    local_1f8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"vertex","");
    paVar4 = &local_218.field_2;
    local_218._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"sx","");
    PLYReader::setReceiver(this_00,&local_1f8,&local_218,&local_258.super_PLYReceiver);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar4) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    local_1f8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"vertex","");
    local_218._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"sy","");
    PLYReader::setReceiver(this_00,&local_1f8,&local_218,&local_278.super_PLYReceiver);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar4) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    local_1f8._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"vertex","");
    local_218._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"sz","");
    PLYReader::setReceiver(this_00,&local_1f8,&local_218,&local_70.super_PLYReceiver);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar4) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
  }
  PLYReader::readData(this_00);
  return;
}

Assistant:

void PointCloud::loadPLY(PLYReader &ply)
{
  int vn=static_cast<int>(ply.instancesOfElement("vertex"));

  setOriginFromPLY(ply);

  // set receiver for point cloud

  resizeVertexList(vn,
                   ply.getTypeOfProperty("vertex", "scan_size") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_error") != ply_none ||
                   ply.getTypeOfProperty("vertex", "scan_conf") != ply_none,
                   ply.getTypeOfProperty("vertex", "sx") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sy") != ply_none &&
                   ply.getTypeOfProperty("vertex", "sz") != ply_none);

  FloatArrayReceiver vx(getVertexArray(), 3, 0), vy(getVertexArray(), 3, 1), vz(getVertexArray(), 3,
      2);

  ply.setReceiver("vertex", "x", &vx);
  ply.setReceiver("vertex", "y", &vy);
  ply.setReceiver("vertex", "z", &vz);

  FloatArrayReceiver ss(getScanPropArray(), 3, 0), se(getScanPropArray(), 3, 1),
                     sc(getScanPropArray(), 3, 2);

  if (hasScanProp())
  {
    ply.setReceiver("vertex", "scan_size", &ss);
    ply.setReceiver("vertex", "scan_error", &se);
    ply.setReceiver("vertex", "scan_conf", &sc);
  }

  FloatArrayReceiver sx(getScanPosArray(), 3, 0), sy(getScanPosArray(), 3, 1), sz(getScanPosArray(),
      3, 2);

  if (hasScanPos())
  {
    ply.setReceiver("vertex", "sx", &sx);
    ply.setReceiver("vertex", "sy", &sy);
    ply.setReceiver("vertex", "sz", &sz);
  }

  // read data

  ply.readData();
}